

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O2

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  ulong uVar1;
  
  free_string_field(&args_info->input_arg);
  free_string_field(&args_info->input_orig);
  free_string_field(&args_info->output_arg);
  free_string_field(&args_info->output_orig);
  free_string_field(&args_info->sele1_arg);
  free_string_field(&args_info->sele1_orig);
  free_string_field(&args_info->sele2_arg);
  free_string_field(&args_info->sele2_orig);
  free_string_field(&args_info->nbins_orig);
  free_string_field(&args_info->nbins_z_orig);
  free_string_field(&args_info->privilegedAxis_orig);
  free_string_field(&args_info->centroidX_orig);
  free_string_field(&args_info->centroidY_orig);
  free_string_field(&args_info->referenceZ_orig);
  free_string_field(&args_info->dropletR_orig);
  free_string_field(&args_info->threshDens_orig);
  free_string_field(&args_info->bufferLength_orig);
  free_string_field(&args_info->rcut_orig);
  for (uVar1 = 0; uVar1 < args_info->inputs_num; uVar1 = uVar1 + 1) {
    free(args_info->inputs[uVar1]);
  }
  if (args_info->inputs_num != 0) {
    free(args_info->inputs);
  }
  args_info->sequentialProps_group_counter = 0;
  args_info->help_given = 0;
  args_info->version_given = 0;
  args_info->input_given = 0;
  args_info->output_given = 0;
  args_info->sele1_given = 0;
  args_info->sele2_given = 0;
  args_info->nbins_given = 0;
  args_info->nbins_z_given = 0;
  args_info->privilegedAxis_given = 0;
  args_info->centroidX_given = 0;
  args_info->centroidY_given = 0;
  args_info->referenceZ_given = 0;
  args_info->dropletR_given = 0;
  args_info->threshDens_given = 0;
  args_info->bufferLength_given = 0;
  args_info->rcut_given = 0;
  args_info->com_given = 0;
  args_info->comvel_given = 0;
  args_info->deltaCount_given = 0;
  args_info->fluxOut_given = 0;
  args_info->ca1_given = 0;
  args_info->ca2_given = 0;
  args_info->gcn_given = 0;
  args_info->testequi_given = 0;
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->input_arg));
  free_string_field (&(args_info->input_orig));
  free_string_field (&(args_info->output_arg));
  free_string_field (&(args_info->output_orig));
  free_string_field (&(args_info->sele1_arg));
  free_string_field (&(args_info->sele1_orig));
  free_string_field (&(args_info->sele2_arg));
  free_string_field (&(args_info->sele2_orig));
  free_string_field (&(args_info->nbins_orig));
  free_string_field (&(args_info->nbins_z_orig));
  free_string_field (&(args_info->privilegedAxis_orig));
  free_string_field (&(args_info->centroidX_orig));
  free_string_field (&(args_info->centroidY_orig));
  free_string_field (&(args_info->referenceZ_orig));
  free_string_field (&(args_info->dropletR_orig));
  free_string_field (&(args_info->threshDens_orig));
  free_string_field (&(args_info->bufferLength_orig));
  free_string_field (&(args_info->rcut_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}